

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall
Assimp::PretransformVertices::GetVFormatList
          (PretransformVertices *this,aiScene *pcScene,uint iMat,
          list<unsigned_int,_std::allocator<unsigned_int>_> *aiOut)

{
  list<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint local_3c;
  aiMesh *local_38;
  aiMesh *pcMesh;
  list<unsigned_int,_std::allocator<unsigned_int>_> *plStack_28;
  uint i;
  list<unsigned_int,_std::allocator<unsigned_int>_> *aiOut_local;
  aiScene *paStack_18;
  uint iMat_local;
  aiScene *pcScene_local;
  PretransformVertices *this_local;
  
  plStack_28 = aiOut;
  aiOut_local._4_4_ = iMat;
  paStack_18 = pcScene;
  pcScene_local = (aiScene *)this;
  for (pcMesh._4_4_ = 0; this_00 = plStack_28, pcMesh._4_4_ < paStack_18->mNumMeshes;
      pcMesh._4_4_ = pcMesh._4_4_ + 1) {
    local_38 = paStack_18->mMeshes[pcMesh._4_4_];
    if (aiOut_local._4_4_ == local_38->mMaterialIndex) {
      local_3c = GetMeshVFormat(this,local_38);
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_3c);
    }
  }
  return;
}

Assistant:

void PretransformVertices::GetVFormatList( aiScene* pcScene, unsigned int iMat,
    std::list<unsigned int>& aiOut)
{
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)
    {
        aiMesh* pcMesh = pcScene->mMeshes[ i ];
        if (iMat == pcMesh->mMaterialIndex) {
            aiOut.push_back(GetMeshVFormat(pcMesh));
        }
    }
}